

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetupScrollFreeze(int columns,int rows)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImGuiTable *pIVar3;
  ImGuiTableColumnIdx IVar4;
  ImGuiTableColumnIdx IVar5;
  ImGuiTableColumnIdx IVar6;
  
  IVar5 = (ImGuiTableColumnIdx)rows;
  IVar4 = (ImGuiTableColumnIdx)columns;
  pIVar3 = GImGui->CurrentTable;
  if (((uint)pIVar3->Flags >> 0x18 & 1) == 0) {
    IVar4 = '\0';
  }
  pIVar3->FreezeColumnsRequest = IVar4;
  pIVar1 = &pIVar3->InnerWindow->Scroll;
  IVar6 = '\0';
  if (pIVar1->x != 0.0) {
    IVar6 = IVar4;
  }
  if (NAN(pIVar1->x)) {
    IVar6 = IVar4;
  }
  pIVar3->FreezeColumnsCount = IVar6;
  if (((uint)pIVar3->Flags >> 0x19 & 1) == 0) {
    IVar5 = '\0';
  }
  pIVar3->FreezeRowsRequest = IVar5;
  pfVar2 = &(pIVar3->InnerWindow->Scroll).y;
  IVar4 = '\0';
  if (*pfVar2 != 0.0) {
    IVar4 = IVar5;
  }
  if (NAN(*pfVar2)) {
    IVar4 = IVar5;
  }
  pIVar3->FreezeRowsCount = IVar4;
  pIVar3->IsUnfrozenRows = IVar4 == '\0';
  return;
}

Assistant:

void ImGui::TableSetupScrollFreeze(int columns, int rows)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call TableSetupColumn() before first row!");
    IM_ASSERT(columns >= 0 && columns < IMGUI_TABLE_MAX_COLUMNS);
    IM_ASSERT(rows >= 0 && rows < 128); // Arbitrary limit

    table->FreezeColumnsRequest = (table->Flags & ImGuiTableFlags_ScrollX) ? (ImGuiTableColumnIdx)columns : 0;
    table->FreezeColumnsCount = (table->InnerWindow->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->FreezeRowsRequest = (table->Flags & ImGuiTableFlags_ScrollY) ? (ImGuiTableColumnIdx)rows : 0;
    table->FreezeRowsCount = (table->InnerWindow->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->IsUnfrozenRows = (table->FreezeRowsCount == 0); // Make sure this is set before TableUpdateLayout() so ImGuiListClipper can benefit from it.b
}